

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JupiterAce.cpp
# Opt level: O2

int GetDeepThoughtDataOffset(Data *data)

{
  pointer puVar1;
  int iVar2;
  long lVar3;
  
  puVar1 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = (int)(data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish - (int)puVar1;
  lVar3 = 0;
  while( true ) {
    if (iVar2 <= lVar3) {
      return 0;
    }
    if (((puVar1[lVar3] == 0xff) && ((int)lVar3 + 2 < iVar2)) && (puVar1[lVar3 + 1] == '*')) break;
    lVar3 = lVar3 + 1;
  }
  return (int)lVar3 + 2;
}

Assistant:

int GetDeepThoughtDataOffset(const Data& data)
{
    for (auto i = 0; i < data.size(); ++i)
    {
        // Check for 255 sync byte
        if (data[i] != 255)
            continue;

        // If 255 is followed by 42 we've found the data start
        if ((i + 2) < data.size() && data[i + 1] == 42)
            return i + 2;
    }

    // Not found
    return 0;
}